

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcasestr_s.c
# Opt level: O1

errno_t strcasestr_s(char *dest,rsize_t dmax,char *src,rsize_t slen,char **substring)

{
  char cVar1;
  long lVar2;
  code *pcVar3;
  __int32_t **pp_Var4;
  errno_t error;
  errno_t eVar5;
  long lVar6;
  char *msg;
  rsize_t rVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (substring == (char **)0x0) {
    msg = "strcasestr_s: substring is null";
LAB_00104814:
    eVar5 = 400;
    error = 400;
  }
  else {
    *substring = (char *)0x0;
    if (dest == (char *)0x0) {
      msg = "strcasestr_s: dest is null";
      goto LAB_00104814;
    }
    if (dmax == 0) {
      msg = "strcasestr_s: dmax is 0";
LAB_00104829:
      eVar5 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        if (src == (char *)0x0) {
          msg = "strcasestr_s: src is null";
          goto LAB_00104814;
        }
        if (slen == 0) {
          msg = "strcasestr_s: slen is 0";
          goto LAB_00104829;
        }
        if (slen < 0x10000001) {
          if ((dest == src) || (*src == '\0')) {
            *substring = dest;
LAB_0010495c:
            eVar5 = 0;
          }
          else {
            do {
              if (*dest == '\0') break;
              lVar6 = 0x100000000;
              rVar7 = 0;
LAB_001048c4:
              cVar1 = dest[rVar7];
              if ((((long)cVar1 != 0) && (dmax != rVar7)) &&
                 (pp_Var4 = __ctype_toupper_loc(), (*pp_Var4)[cVar1] == (*pp_Var4)[src[rVar7]])) {
                if (rVar7 == 0x7fffffff) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                if (src[lVar6 >> 0x20] != '\0') goto code_r0x00104912;
                goto LAB_00104955;
              }
              dest = dest + 1;
              dmax = dmax - 1;
            } while (dmax != 0);
            *substring = (char *)0x0;
            eVar5 = 0x199;
          }
          goto LAB_0010483a;
        }
        msg = "strcasestr_s: slen exceeds max";
      }
      else {
        msg = "strcasestr_s: dmax exceeds max";
      }
      eVar5 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_0010483a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return eVar5;
code_r0x00104912:
  lVar6 = lVar6 + 0x100000000;
  bVar8 = slen - 1 == rVar7;
  rVar7 = rVar7 + 1;
  if (bVar8) {
LAB_00104955:
    *substring = dest;
    goto LAB_0010495c;
  }
  goto LAB_001048c4;
}

Assistant:

errno_t
strcasestr_s (char *dest, rsize_t dmax,
              const char *src, rsize_t slen, char **substring)
{
    rsize_t len;
    rsize_t dlen;
    int i;

    if (substring == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: substring is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *substring = NULL;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcasestr_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcasestr_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcasestr_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        invoke_safe_str_constraint_handler("strcasestr_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcasestr_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /*
     * src points to a string with zero length, or
     * src equals dest, return dest
     */
    if (*src == '\0' || dest == src) {
        *substring = dest;
        return (EOK);
    }

    while (dmax && *dest) {
        i = 0;
        len = slen;
        dlen = dmax;

        while (dest[i] && dlen) {

            /* not a match, not a substring */
            if (toupper(dest[i]) != toupper(src[i])) {
                break;
            }

            /* move to the next char */
            i++;
            len--;
            dlen--;

            if (src[i] == '\0' || !len) {
                *substring = dest;
                return (EOK);
            }
        }
        dest++;
        dmax--;
    }

    /*
     * substring was not found, return NULL
     */
    *substring = NULL;
    return (ESNOTFND);
}